

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraSublimeTextGenerator::AppendAllTargets
          (cmExtraSublimeTextGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,cmMakefile *mf,
          cmGeneratedFileStream *fout,MapSourceFileFlags *sourceFileFlags)

{
  cmLocalGenerator *pcVar1;
  bool bVar2;
  TargetType TVar3;
  int iVar4;
  char *pcVar5;
  const_reference ppcVar6;
  char *pcVar7;
  reference ppcVar8;
  cmMakefile *this_00;
  pointer ppVar9;
  long lVar10;
  pointer ppVar11;
  undefined1 local_158 [8];
  string fastTarget;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_130;
  iterator ti;
  cmTargets *targets;
  cmMakefile *makefile;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_110;
  const_iterator lg;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0 [8];
  string compiler;
  allocator local_79;
  string local_78;
  string local_58 [8];
  string make;
  MapSourceFileFlags *sourceFileFlags_local;
  cmGeneratedFileStream *fout_local;
  cmMakefile *mf_local;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs_local;
  cmExtraSublimeTextGenerator *this_local;
  
  make.field_2._8_8_ = sourceFileFlags;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"CMAKE_MAKE_PROGRAM",&local_79);
  pcVar5 = cmMakefile::GetRequiredDefinition(mf,&local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,pcVar5,(allocator *)(compiler.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator((allocator<char> *)(compiler.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"",&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  bVar2 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::empty(lgs);
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"all",&local_d9);
    ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    pcVar1 = *ppcVar6;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    AppendTarget(this,fout,&local_d8,pcVar1,(cmTarget *)0x0,pcVar5,mf,pcVar7,
                 (MapSourceFileFlags *)make.field_2._8_8_,true);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_100,"clean",(allocator *)((long)&lg._M_current + 7));
    ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (lgs,0);
    pcVar1 = *ppcVar6;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    AppendTarget(this,fout,&local_100,pcVar1,(cmTarget *)0x0,pcVar5,mf,pcVar7,
                 (MapSourceFileFlags *)make.field_2._8_8_,false);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lg._M_current + 7));
  }
  local_110._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(lgs);
  do {
    makefile = (cmMakefile *)
               std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(lgs);
    bVar2 = __gnu_cxx::operator!=
                      (&local_110,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&makefile);
    if (!bVar2) {
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_58);
      return;
    }
    ppcVar8 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_110);
    this_00 = cmLocalGenerator::GetMakefile(*ppcVar8);
    ti.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               )cmMakefile::GetTargets_abi_cxx11_(this_00);
    local_130._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  *)ti.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                    ._M_cur);
    while( true ) {
      fastTarget.field_2._8_8_ =
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
           ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  *)ti.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                    ._M_cur);
      bVar2 = std::__detail::operator!=
                        (&local_130,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          *)((long)&fastTarget.field_2 + 8));
      if (!bVar2) break;
      ppVar9 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                             *)&local_130);
      TVar3 = cmTarget::GetType(&ppVar9->second);
      if (TVar3 < UTILITY) {
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_130);
        ppcVar8 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&local_110);
        pcVar1 = *ppcVar8;
        ppVar11 = std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                  ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                *)&local_130);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        AppendTarget(this,fout,&ppVar9->first,pcVar1,&ppVar11->second,pcVar5,this_00,pcVar7,
                     (MapSourceFileFlags *)make.field_2._8_8_,false);
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_130);
        std::__cxx11::string::string((string *)local_158,(string *)ppVar9);
        std::__cxx11::string::operator+=((string *)local_158,"/fast");
        ppcVar8 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&local_110);
        pcVar1 = *ppcVar8;
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_130);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        AppendTarget(this,fout,(string *)local_158,pcVar1,&ppVar9->second,pcVar5,this_00,pcVar7,
                     (MapSourceFileFlags *)make.field_2._8_8_,false);
        std::__cxx11::string::~string((string *)local_158);
      }
      else if (TVar3 == UTILITY) {
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_130);
        lVar10 = std::__cxx11::string::find((char *)ppVar9,0x97a374);
        if (lVar10 == 0) {
          ppVar9 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_130);
          bVar2 = std::operator!=(&ppVar9->first,"Nightly");
          if (bVar2) goto LAB_0074a8b5;
        }
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_130);
        lVar10 = std::__cxx11::string::find((char *)ppVar9,0x97a37c);
        if (lVar10 == 0) {
          ppVar9 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_130);
          bVar2 = std::operator!=(&ppVar9->first,"Continuous");
          if (bVar2) goto LAB_0074a8b5;
        }
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_130);
        lVar10 = std::__cxx11::string::find((char *)ppVar9,0x97a387);
        if (lVar10 == 0) {
          ppVar9 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_130);
          bVar2 = std::operator!=(&ppVar9->first,"Experimental");
          if (bVar2) goto LAB_0074a8b5;
        }
        ppVar9 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                               *)&local_130);
        ppcVar8 = __gnu_cxx::
                  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                  ::operator*(&local_110);
        pcVar1 = *ppcVar8;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        AppendTarget(this,fout,&ppVar9->first,pcVar1,(cmTarget *)0x0,pcVar5,this_00,pcVar7,
                     (MapSourceFileFlags *)make.field_2._8_8_,false);
      }
      else if (TVar3 == GLOBAL_TARGET) {
        pcVar5 = cmMakefile::GetCurrentBinaryDirectory(this_00);
        pcVar7 = cmMakefile::GetHomeOutputDirectory(this_00);
        iVar4 = strcmp(pcVar5,pcVar7);
        if (iVar4 == 0) {
          ppVar9 = std::__detail::
                   _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                                 *)&local_130);
          ppcVar8 = __gnu_cxx::
                    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                    ::operator*(&local_110);
          pcVar1 = *ppcVar8;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          AppendTarget(this,fout,&ppVar9->first,pcVar1,(cmTarget *)0x0,pcVar5,this_00,pcVar7,
                       (MapSourceFileFlags *)make.field_2._8_8_,false);
        }
      }
LAB_0074a8b5:
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                    *)&local_130,0);
    }
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_110,0);
  } while( true );
}

Assistant:

void cmExtraSublimeTextGenerator::
  AppendAllTargets(const std::vector<cmLocalGenerator*>& lgs,
                   const cmMakefile* mf,
                   cmGeneratedFileStream& fout,
                   MapSourceFileFlags& sourceFileFlags)
{
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = "";
  if (!lgs.empty())
    {
      this->AppendTarget(fout, "all", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, true);
      this->AppendTarget(fout, "clean", lgs[0], 0, make.c_str(), mf,
                         compiler.c_str(), sourceFileFlags, false);
    }

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp(makefile->GetCurrentBinaryDirectory(),
                     makefile->GetHomeOutputDirectory())==0)
            {
            this->AppendTarget(fout, ti->first, *lg, 0,
                               make.c_str(), makefile, compiler.c_str(),
                               sourceFileFlags, false);
            }
          }
          break;
        case cmTarget::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((ti->first.find("Nightly")==0)   &&(ti->first!="Nightly"))
             || ((ti->first.find("Continuous")==0)&&(ti->first!="Continuous"))
             || ((ti->first.find("Experimental")==0)
                                               && (ti->first!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, ti->first, *lg, 0,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          break;
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
          {
          this->AppendTarget(fout, ti->first, *lg, &ti->second,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          std::string fastTarget = ti->first;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, *lg, &ti->second,
                             make.c_str(), makefile, compiler.c_str(),
                             sourceFileFlags, false);
          }
          break;
        default:
          break;
        }
      }
    }
}